

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O1

void shuffle(vector<int,_std::allocator<int>_> *v)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  bool bVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  srand(9);
  uVar6 = (uint)((ulong)((long)(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  if (1 < (int)uVar6) {
    uVar7 = (ulong)(uVar6 & 0x7fffffff);
    do {
      piVar2 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      uVar6 = rand();
      uVar5 = (ulong)uVar6 % (uVar7 & 0xffffffff);
      piVar3 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      iVar1 = piVar2[uVar7 - 1];
      piVar2[uVar7 - 1] = piVar3[uVar5];
      piVar3[uVar5] = iVar1;
      bVar4 = 2 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar4);
  }
  return;
}

Assistant:

static void shuffle(vector<int>* v) {
  srand(9);
  for (int n = v->size(); n >= 2; n--) {
    swap((*v)[n - 1], (*v)[static_cast<unsigned>(rand()) % n]);
  }
}